

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O1

void ImGui::SFML::Update(Window *window,RenderTarget *target,Time dt)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ImGuiMouseCursor IVar4;
  uint uVar5;
  ImGuiIO *pIVar6;
  undefined4 extraout_var;
  Vector2i VVar8;
  undefined4 extraout_var_00;
  Vector2f *displaySize;
  Vector2f *mousePos;
  Vector2f local_38;
  Vector2f local_30;
  ulong uVar7;
  
  displaySize = &local_38;
  mousePos = &local_38;
  SetCurrentWindow(window);
  if ((anonymous_namespace)::s_currWindowCtx != 0) {
    pIVar6 = GetIO();
    iVar3 = -1;
    if (pIVar6->MouseDrawCursor == false) {
      iVar3 = GetMouseCursor();
    }
    if (*(int *)((anonymous_namespace)::s_currWindowCtx + 0x40) != iVar3) {
      *(int *)((anonymous_namespace)::s_currWindowCtx + 0x40) = iVar3;
      pIVar6 = GetIO();
      if ((pIVar6->ConfigFlags & 0x20) == 0) {
        IVar4 = GetMouseCursor();
        if ((IVar4 == -1) || (pIVar6->MouseDrawCursor != false)) {
          sf::Window::setMouseCursorVisible(window,false);
        }
        else {
          sf::Window::setMouseCursorVisible(window,true);
          lVar1 = (anonymous_namespace)::s_currWindowCtx + (long)IVar4 * 8;
          if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x110 + (long)IVar4) == '\0') {
            lVar1 = (anonymous_namespace)::s_currWindowCtx;
          }
          sf::Window::setMouseCursor(window,(Cursor *)(lVar1 + 200));
        }
      }
    }
    if (*(char *)((anonymous_namespace)::s_currWindowCtx + 0x39) == '\0') {
      bVar2 = sf::Touch::isDown(0);
      if (bVar2) {
        VVar8 = sf::Touch::getPosition(0,window);
        *(Vector2i *)((anonymous_namespace)::s_currWindowCtx + 0x48) = VVar8;
      }
      mousePos = (Vector2f *)((anonymous_namespace)::s_currWindowCtx + 0x48);
      uVar5 = (*target->_vptr_RenderTarget[2])(target);
      uVar7 = CONCAT44(extraout_var_00,uVar5);
    }
    else {
      local_38 = (Vector2f)sf::Mouse::getPosition(window);
      uVar5 = (*target->_vptr_RenderTarget[2])(target);
      uVar7 = CONCAT44(extraout_var,uVar5);
      displaySize = &local_30;
    }
    displaySize->x = (float)uVar5;
    displaySize->y = (float)(uVar7 >> 0x20);
    Update((Vector2i *)mousePos,displaySize,dt);
    return;
  }
  __assert_fail("s_currWindowCtx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-sfml-src/imgui-SFML.cpp"
                ,0x1af,"void ImGui::SFML::Update(sf::Window &, sf::RenderTarget &, sf::Time)");
}

Assistant:

void Update(sf::Window& window, sf::RenderTarget& target, sf::Time dt) {
    SetCurrentWindow(window);
    assert(s_currWindowCtx);

    // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    ImGuiMouseCursor mouse_cursor =
        ImGui::GetIO().MouseDrawCursor ? ImGuiMouseCursor_None : ImGui::GetMouseCursor();
    if (s_currWindowCtx->lastCursor != mouse_cursor) {
        s_currWindowCtx->lastCursor = mouse_cursor;
        updateMouseCursor(window);
    }

    if (!s_currWindowCtx->mouseMoved) {
        if (sf::Touch::isDown(0)) s_currWindowCtx->touchPos = sf::Touch::getPosition(0, window);

        Update(s_currWindowCtx->touchPos, static_cast<sf::Vector2f>(target.getSize()), dt);
    } else {
        Update(sf::Mouse::getPosition(window), static_cast<sf::Vector2f>(target.getSize()), dt);
    }
}